

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.cpp
# Opt level: O2

size_t duckdb_zstd::FSE_buildDTable_internal
                 (FSE_DTable *dt,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  size_t sVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  undefined2 uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ushort uVar11;
  ulong uVar12;
  uint uVar13;
  U32 s;
  ulong uVar14;
  short sVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  
  bVar3 = (byte)tableLog;
  uVar13 = 1 << (bVar3 & 0x1f);
  sVar1 = 0xffffffffffffffd2;
  if ((maxSymbolValue < 0x100) &&
     (uVar18 = (ulong)(maxSymbolValue + 1), (1L << (bVar3 & 0x3f)) + uVar18 * 2 + 8 <= wkspSize)) {
    if (tableLog < 0xd) {
      lVar2 = (long)workSpace + (ulong)maxSymbolValue * 2 + 2;
      uVar6 = uVar13 - 1;
      uVar7 = 1;
      uVar5 = uVar6;
      for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
        sVar15 = normalizedCounter[uVar14];
        if (sVar15 == -1) {
          uVar12 = (ulong)uVar5;
          uVar5 = uVar5 - 1;
          *(char *)((long)dt + uVar12 * 4 + 6) = (char)uVar14;
          sVar15 = 1;
        }
        else if ((int)((uint)(0x8000 << (bVar3 & 0x1f)) >> 0x10) <= (int)sVar15) {
          uVar7 = 0;
        }
        *(short *)((long)workSpace + uVar14 * 2) = sVar15;
      }
      *(short *)dt = (short)tableLog;
      *(undefined2 *)((long)dt + 2) = uVar7;
      iVar10 = (uVar13 >> 1) + (uVar13 >> 3) + 3;
      if (uVar5 == uVar6) {
        lVar16 = 0;
        lVar9 = 0;
        for (uVar14 = 0; uVar14 != uVar18; uVar14 = uVar14 + 1) {
          sVar15 = normalizedCounter[uVar14];
          *(long *)(lVar2 + lVar9) = lVar16;
          for (lVar19 = 8; lVar19 < sVar15; lVar19 = lVar19 + 8) {
            *(long *)((long)workSpace + lVar19 + lVar9 + (ulong)maxSymbolValue * 2 + 2) = lVar16;
          }
          lVar9 = lVar9 + sVar15;
          lVar16 = lVar16 + 0x101010101010101;
        }
        uVar5 = 0;
        for (uVar18 = 0; uVar18 < uVar13; uVar18 = uVar18 + 2) {
          uVar8 = uVar5;
          for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
            *(undefined1 *)((long)dt + (ulong)(uVar8 & uVar6) * 4 + 6) =
                 *(undefined1 *)(lVar2 + lVar9);
            uVar8 = uVar8 + iVar10;
          }
          uVar5 = uVar5 + iVar10 * 2 & uVar6;
          lVar2 = lVar2 + 2;
        }
      }
      else {
        uVar8 = 0;
        for (uVar14 = 0; uVar14 != uVar18; uVar14 = uVar14 + 1) {
          uVar11 = normalizedCounter[uVar14];
          uVar17 = 0;
          if ((short)uVar11 < 1) {
            uVar11 = 0;
          }
          for (; uVar17 != uVar11; uVar17 = uVar17 + 1) {
            *(char *)((long)dt + (ulong)uVar8 * 4 + 6) = (char)uVar14;
            do {
              uVar8 = uVar8 + iVar10 & uVar6;
            } while (uVar5 < uVar8);
          }
        }
        if (uVar8 != 0) {
          return 0xffffffffffffffff;
        }
      }
      sVar1 = 0;
      for (uVar18 = 0; uVar13 != uVar18; uVar18 = uVar18 + 1) {
        uVar14 = (ulong)*(byte *)((long)dt + uVar18 * 4 + 6);
        uVar11 = *(ushort *)((long)workSpace + uVar14 * 2);
        *(ushort *)((long)workSpace + uVar14 * 2) = uVar11 + 1;
        iVar10 = 0x1f;
        if (uVar11 != 0) {
          for (; uVar11 >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        bVar4 = bVar3 - (char)iVar10;
        *(byte *)((long)dt + uVar18 * 4 + 7) = bVar4;
        *(ushort *)(dt + uVar18 + 1) = (uVar11 << (bVar4 & 0x1f)) - (short)uVar13;
      }
    }
    else {
      sVar1 = 0xffffffffffffffd4;
    }
  }
  return sVar1;
}

Assistant:

static size_t FSE_buildDTable_internal(FSE_DTable* dt, const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    void* const tdPtr = dt+1;   /* because *dt is unsigned, 32-bits aligned on 32-bits */
    FSE_DECODE_TYPE* const tableDecode = (FSE_DECODE_TYPE*) (tdPtr);
    U16* symbolNext = (U16*)workSpace;
    BYTE* spread = (BYTE*)(symbolNext + maxSymbolValue + 1);

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    if (FSE_BUILD_DTABLE_WKSP_SIZE(tableLog, maxSymbolValue) > wkspSize) return ERROR(maxSymbolValue_tooLarge);
    if (maxSymbolValue > FSE_MAX_SYMBOL_VALUE) return ERROR(maxSymbolValue_tooLarge);
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);

    /* Init, lay down lowprob symbols */
    {   FSE_DTableHeader DTableH;
        DTableH.tableLog = (U16)tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].symbol = (FSE_FUNCTION_TYPE)s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = (U16)normalizedCounter[s];
        }   }   }
        ZSTD_memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        size_t const tableMask = tableSize-1;
        size_t const step = FSE_TABLESTEP(tableSize);
        /* First lay down the symbols in order.
         * We use a uint64_t to lay down 8 bytes at a time. This reduces branch
         * misses since small blocks generally have small table logs, so nearly
         * all symbols have counts <= 8. We ensure we have 8 bytes at the end of
         * our buffer to handle the over-write.
         */
        {   U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                pos += (size_t)n;
        }   }
        /* Now we spread those positions across the table.
         * The benefit of doing it in two stages is that we avoid the
         * variable size inner loop, which caused lots of branch misses.
         * Now we can run through all the positions without any branch misses.
         * We unroll the loop twice, since that is what empirically worked best.
         */
        {
            size_t position = 0;
            size_t s;
            size_t const unroll = 2;
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableDecode[uPosition].symbol = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);
        }
    } else {
        U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].symbol = (FSE_FUNCTION_TYPE)s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        if (position!=0) return ERROR(GENERIC);   /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            FSE_FUNCTION_TYPE const symbol = (FSE_FUNCTION_TYPE)(tableDecode[u].symbol);
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - ZSTD_highbit32(nextState) );
            tableDecode[u].newState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
    }   }

    return 0;
}